

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O0

void __thiscall
Centaurus::NFABaseState<unsigned_char,_Centaurus::IndexVector>::print
          (NFABaseState<unsigned_char,_Centaurus::IndexVector> *this,wostream *os,int from)

{
  bool bVar1;
  int iVar2;
  reference this_00;
  wostream *pwVar3;
  CharClass<unsigned_char> *cc;
  NFATransition<unsigned_char> *t;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  *__range2;
  int from_local;
  wostream *os_local;
  NFABaseState<unsigned_char,_Centaurus::IndexVector> *this_local;
  
  __end0 = std::
           vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
           ::begin(&this->m_transitions);
  t = (NFATransition<unsigned_char> *)
      std::
      vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
      ::end(&this->m_transitions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_Centaurus::NFATransition<unsigned_char>_*,_std::vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>_>
                                *)&t);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_Centaurus::NFATransition<unsigned_char>_*,_std::vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>_>
              ::operator*(&__end0);
    pwVar3 = std::operator<<(os,L"S");
    pwVar3 = (wostream *)std::wostream::operator<<(pwVar3,from);
    pwVar3 = std::operator<<(pwVar3,L" -> ");
    pwVar3 = std::operator<<(pwVar3,L"S");
    iVar2 = NFATransition<unsigned_char>::dest(this_00);
    pwVar3 = (wostream *)std::wostream::operator<<(pwVar3,iVar2);
    std::operator<<(pwVar3,L" [ label=\"");
    cc = NFATransition<unsigned_char>::label(this_00);
    Centaurus::operator<<(os,cc);
    bVar1 = NFATransition<unsigned_char>::is_long(this_00);
    if (bVar1) {
      pwVar3 = std::operator<<(os,L"\", penwidth=3, arrowsize=3 ];");
      std::wostream::operator<<(pwVar3,std::endl<wchar_t,std::char_traits<wchar_t>>);
    }
    else {
      pwVar3 = std::operator<<(os,L"\" ];");
      std::wostream::operator<<(pwVar3,std::endl<wchar_t,std::char_traits<wchar_t>>);
    }
    __gnu_cxx::
    __normal_iterator<const_Centaurus::NFATransition<unsigned_char>_*,_std::vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

virtual void print(std::wostream& os, int from) const
	{
		for (const auto& t : m_transitions)
		{
			os << L"S" << from << L" -> " << L"S" << t.dest() << L" [ label=\"";
			os << t.label();
            if (!t.is_long())
            {
                os << L"\" ];" << std::endl;
            }
            else
            {
                os << L"\", penwidth=3, arrowsize=3 ];" << std::endl;
            }
		}
	}